

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O1

void __thiscall
t_go_generator::generate_go_struct_writer
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *tstruct_name,bool is_result,
          bool uses_countsetfields)

{
  int *piVar1;
  long lVar2;
  t_field *tfield;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  undefined4 extraout_var_00;
  t_go_generator *this_00;
  int iVar5;
  pointer pptVar6;
  string field_method_prefix;
  string field_name;
  string escape_field_name;
  string name;
  string local_138;
  string local_118;
  t_struct *local_f8;
  string local_f0;
  e_req local_cc;
  string local_c8;
  ostream *local_a8;
  string local_a0;
  string *local_80;
  string *local_78;
  char *local_70;
  long local_68;
  char local_60 [16];
  string local_50;
  
  local_f8 = tstruct;
  local_80 = tstruct_name;
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  local_70 = local_60;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,lVar2,((long *)CONCAT44(extraout_var,iVar3))[1] + lVar2);
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"func (p *",9);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(local_80->_M_dataplus)._M_p,local_80->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->write_method_name_)._M_dataplus._M_p,
                      (this->write_method_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"(ctx context.Context, oprot thrift.TProtocol) error {",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  if ((uses_countsetfields & local_f8->is_union_) == 1) {
    iVar3 = (*(local_f8->super_t_type).super_t_doc._vptr_t_doc[3])();
    publicize(&local_f0,this,(string *)CONCAT44(extraout_var_00,iVar3),false,
              &(this->super_t_generator).service_name_);
    t_generator::indent_abi_cxx11_(&local_c8,&this->super_t_generator);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if c := p.CountSetFields",0x18);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(); c != 1 {",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_118,&this->super_t_generator);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "  return fmt.Errorf(\"%T write union: exactly one field must be set (%d set).\", p, c)"
               ,0x54);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_138,&this->super_t_generator);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_138._M_dataplus._M_p,local_138._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  t_generator::indent_abi_cxx11_(&local_f0,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"if err := oprot.WriteStructBegin(ctx, \"",0x27);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"); err != nil {",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_f0,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "  return thrift.PrependError(fmt.Sprintf(\"%T write struct begin error: \", p), err) }"
             ,0x54);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  t_generator::indent_abi_cxx11_(&local_118,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if p != nil {",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  pptVar6 = (local_f8->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_a8 = out;
  if (pptVar6 !=
      (local_f8->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"writeField","");
      std::__cxx11::string::_M_assign((string *)&local_f0);
      (*(this->super_t_generator)._vptr_t_generator[3])(&local_138,this,&local_f0);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      iVar3 = (*pptVar6)->key_;
      if (iVar3 < 0) {
        std::__cxx11::string::append((char *)&local_118);
        iVar3 = -iVar3;
      }
      t_generator::indent_abi_cxx11_(&local_138,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_a8,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if err := p.",0xc);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_118._M_dataplus._M_p,local_118._M_string_length);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"(ctx, oprot); err != nil { return err }",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      out = local_a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (local_f8->members_in_id_order_).
             super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_118,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_118,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"if err := oprot.WriteFieldStop(ctx); err != nil {",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_118,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"  return thrift.PrependError(\"write field stop error: \", err) }",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_118,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"if err := oprot.WriteStructEnd(ctx); err != nil {",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_118,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"  return thrift.PrependError(\"write struct stop error: \", err) }",0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_118,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"return nil",10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_118,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  pptVar6 = (local_f8->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar6 !=
      (local_f8->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_78 = &(this->super_t_generator).service_name_;
    do {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"writeField","");
      iVar3 = (*pptVar6)->key_;
      std::__cxx11::string::_M_assign((string *)&local_f0);
      (*(this->super_t_generator)._vptr_t_generator[3])(&local_138,this,&local_f0);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      local_cc = (*pptVar6)->req_;
      iVar5 = iVar3;
      if (iVar3 < 0) {
        std::__cxx11::string::append((char *)&local_118);
        iVar5 = -iVar3;
      }
      t_generator::indent_abi_cxx11_(&local_138,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"func (p *",9);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(local_80->_M_dataplus)._M_p,local_80->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_118._M_dataplus._M_p,local_118._M_string_length);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"(ctx context.Context, oprot thrift.TProtocol) (err error) {",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      out = local_a8;
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      if (local_cc == T_OPTIONAL) {
        t_generator::indent_abi_cxx11_(&local_138,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_138._M_dataplus._M_p,local_138._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if p.IsSet",10);
        publicize(&local_a0,this,&local_f0,false,local_78);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_a0._M_dataplus._M_p,local_a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"() {",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
      }
      t_generator::indent_abi_cxx11_(&local_138,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"if err := oprot.WriteFieldBegin(ctx, \"",0x26);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      this_00 = (t_go_generator *)0x38b673;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\", ",3);
      type_to_enum_abi_cxx11_(&local_a0,this_00,(*pptVar6)->type_);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_a0._M_dataplus._M_p,local_a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"); err != nil {",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_138,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"  return thrift.PrependError(fmt.Sprintf(\"%T write field begin error ",
                 0x45);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": \", p), err) }",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      tfield = *pptVar6;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"p.","");
      generate_serialize_field(this,out,tfield,&local_50,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_138,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"if err := oprot.WriteFieldEnd(ctx); err != nil {",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_138,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"  return thrift.PrependError(fmt.Sprintf(\"%T write field end error ",0x43)
      ;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": \", p), err) }",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if (local_cc == T_OPTIONAL) {
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&local_138,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_138._M_dataplus._M_p,local_138._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_138,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  return err",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_138,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (local_f8->members_in_id_order_).
             super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void t_go_generator::generate_go_struct_writer(ostream& out,
                                               t_struct* tstruct,
                                               const string& tstruct_name,
                                               bool is_result,
                                               bool uses_countsetfields) {
  (void)is_result;
  string name(tstruct->get_name());
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;
  indent(out) << "func (p *" << tstruct_name << ") " << write_method_name_ << "(ctx context.Context, oprot thrift.TProtocol) error {" << endl;
  indent_up();
  if (tstruct->is_union() && uses_countsetfields) {
    std::string tstruct_name(publicize(tstruct->get_name()));
    out << indent() << "if c := p.CountSetFields" << tstruct_name << "(); c != 1 {" << endl
        << indent()
        << "  return fmt.Errorf(\"%T write union: exactly one field must be set (%d set).\", p, c)"
        << endl << indent() << "}" << endl;
  }
  out << indent() << "if err := oprot.WriteStructBegin(ctx, \"" << name << "\"); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf("
                     "\"%T write struct begin error: \", p), err) }" << endl;

  string field_name;
  string escape_field_name;
  // t_const_value* field_default_value;
  t_field::e_req field_required;
  int32_t field_id = -1;

  out << indent() << "if p != nil {" << endl;
  indent_up();

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    string field_method_prefix("writeField");
    field_name = (*f_iter)->get_name();
    escape_field_name = escape_string(field_name);
    field_id = (*f_iter)->get_key();
    int32_t field_method_suffix = field_id;

    if (field_method_suffix < 0) {
      field_method_prefix += "_";
      field_method_suffix *= -1;
    }

    out << indent() << "if err := p." << field_method_prefix << field_method_suffix
        << "(ctx, oprot); err != nil { return err }" << endl;
  }

  indent_down();
  out << indent() << "}" << endl;

  // Write the struct map
  out << indent() << "if err := oprot.WriteFieldStop(ctx); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(\"write field stop error: \", err) }" << endl;
  out << indent() << "if err := oprot.WriteStructEnd(ctx); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(\"write struct stop error: \", err) }" << endl;
  out << indent() << "return nil" << endl;
  indent_down();
  out << indent() << "}" << endl << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    string field_method_prefix("writeField");
    field_id = (*f_iter)->get_key();
    field_name = (*f_iter)->get_name();
    escape_field_name = escape_string(field_name);
    // field_default_value = (*f_iter)->get_value();
    field_required = (*f_iter)->get_req();
    int32_t field_method_suffix = field_id;

    if (field_method_suffix < 0) {
      field_method_prefix += "_";
      field_method_suffix *= -1;
    }

    out << indent() << "func (p *" << tstruct_name << ") " << field_method_prefix << field_method_suffix
        << "(ctx context.Context, oprot thrift.TProtocol) (err error) {" << endl;
    indent_up();

    if (field_required == t_field::T_OPTIONAL) {
      out << indent() << "if p.IsSet" << publicize(field_name) << "() {" << endl;
      indent_up();
    }

    out << indent() << "if err := oprot.WriteFieldBegin(ctx, \"" << escape_field_name << "\", "
        << type_to_enum((*f_iter)->get_type()) << ", " << field_id << "); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T write field begin error "
        << field_id << ":" << escape_field_name << ": \", p), err) }" << endl;

    // Write field contents
    generate_serialize_field(out, *f_iter, "p.");

    // Write field closer
    out << indent() << "if err := oprot.WriteFieldEnd(ctx); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T write field end error "
        << field_id << ":" << escape_field_name << ": \", p), err) }" << endl;

    if (field_required == t_field::T_OPTIONAL) {
      indent_down();
      out << indent() << "}" << endl;
    }

    indent_down();
    out << indent() << "  return err" << endl;
    out << indent() << "}" << endl << endl;
  }
}